

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdist.c
# Opt level: O2

void qdist_bin__internal(qdist *to,qdist *from,size_t n)

{
  double *pdVar1;
  double dVar2;
  gsize gVar3;
  size_t sVar4;
  gsize gVar5;
  qdist_entry *pqVar6;
  ulong uVar7;
  gsize gVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  
  qdist_init(to);
  gVar3 = from->n;
  if (gVar3 != 0) {
    gVar8 = n;
    if (gVar3 == 1) {
      gVar8 = gVar3;
    }
    if (n == 0) {
      gVar8 = gVar3;
    }
    pqVar6 = from->entries;
    dVar2 = pqVar6->x;
    dVar10 = qdist_xmax(from);
    auVar11._8_4_ = (int)(gVar8 >> 0x20);
    auVar11._0_8_ = gVar8;
    auVar11._12_4_ = 0x45300000;
    dVar10 = (dVar10 - dVar2) /
             ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)gVar8) - 4503599627370496.0));
    if (gVar8 == gVar3) {
      gVar5 = 0;
      do {
        if (gVar3 == gVar5) {
          pqVar6 = (qdist_entry *)g_realloc_n(to->entries,gVar3,0x10);
          to->entries = pqVar6;
          sVar4 = from->n;
          to->n = sVar4;
          memcpy(pqVar6,from->entries,sVar4 << 4);
          return;
        }
        pdVar1 = &pqVar6->x;
        auVar14._8_4_ = (int)(gVar5 >> 0x20);
        auVar14._0_8_ = gVar5;
        auVar14._12_4_ = 0x45300000;
        dVar15 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)gVar5) - 4503599627370496.0)) * dVar10 + dVar2;
        gVar5 = gVar5 + 1;
        pqVar6 = pqVar6 + 1;
      } while ((*pdVar1 == dVar15) && (!NAN(*pdVar1) && !NAN(dVar15)));
    }
    uVar9 = 0;
    gVar3 = 0;
    while (gVar5 = gVar3, gVar5 != gVar8) {
      auVar12._8_4_ = (int)(gVar5 >> 0x20);
      auVar12._0_8_ = gVar5;
      auVar12._12_4_ = 0x45300000;
      dVar15 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)gVar5) - 4503599627370496.0)) * dVar10 + dVar2;
      gVar3 = gVar5 + 1;
      auVar16._8_4_ = (int)(gVar3 >> 0x20);
      auVar16._0_8_ = gVar3;
      auVar16._12_4_ = 0x45300000;
      dVar13 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)gVar3) - 4503599627370496.0)) * dVar10 + dVar2;
      qdist_add(to,dVar15,0);
      uVar7 = uVar9 << 4 | 8;
      while ((uVar9 < from->n &&
             ((gVar5 == gVar8 - 1 ||
              (pdVar1 = (double *)((long)from->entries + (uVar7 - 8)),
              *pdVar1 <= dVar13 && dVar13 != *pdVar1))))) {
        qdist_add(to,dVar15,*(long *)((long)&from->entries->x + uVar7));
        uVar9 = uVar9 + 1;
        uVar7 = uVar7 + 0x10;
      }
    }
  }
  return;
}

Assistant:

void qdist_bin__internal(struct qdist *to, const struct qdist *from, size_t n)
{
    double xmin, xmax;
    double step;
    size_t i, j;

    qdist_init(to);

    if (from->n == 0) {
        return;
    }
    if (n == 0 || from->n == 1) {
        n = from->n;
    }

    /* set equally-sized bins between @from's left and right */
    xmin = qdist_xmin(from);
    xmax = qdist_xmax(from);
    step = (xmax - xmin) / n;

    if (n == from->n) {
        /* if @from's entries are equally spaced, no need to re-bin */
        for (i = 0; i < from->n; i++) {
            if (from->entries[i].x != xmin + i * step) {
                goto rebin;
            }
        }
        /* they're equally spaced, so copy the dist and bail out */
        to->entries = g_renew(struct qdist_entry, to->entries, n);
        to->n = from->n;
        memcpy(to->entries, from->entries, sizeof(*to->entries) * to->n);
        return;
    }

 rebin:
    j = 0;
    for (i = 0; i < n; i++) {
        double x;
        double left, right;

        left = xmin + i * step;
        right = xmin + (i + 1) * step;

        /* Add x, even if it might not get any counts later */
        x = left;
        qdist_add(to, x, 0);

        /*
         * To avoid double-counting we capture [left, right) ranges, except for
         * the righmost bin, which captures a [left, right] range.
         */
        while (j < from->n && (from->entries[j].x < right || i == n - 1)) {
            struct qdist_entry *o = &from->entries[j];

            qdist_add(to, x, o->count);
            j++;
        }
    }
}